

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void collect_scan_var(gen_ctx_t gen_ctx,MIR_reg_t var)

{
  int iVar1;
  bitmap_t bm;
  VARR_int *pVVar2;
  VARR_MIR_reg_t *pVVar3;
  lr_ctx *plVar4;
  ulong uVar5;
  int *piVar6;
  MIR_reg_t *pMVar7;
  size_t sVar8;
  ulong uVar9;
  
  bm = gen_ctx->temp_bitmap;
  uVar9 = (ulong)var;
  bitmap_expand(bm,uVar9 + 1);
  if (bm != (bitmap_t)0x0) {
    uVar5 = bm->varr[var >> 6];
    bm->varr[var >> 6] = uVar5 | 1L << (uVar9 & 0x3f);
    if (((uVar5 >> (uVar9 & 0x3f) & 1) != 0) || (9999 < gen_ctx->lr_ctx->scan_vars_num)) {
      return;
    }
    while( true ) {
      pVVar2 = gen_ctx->lr_ctx->var_to_scan_var_map;
      if (pVVar2 == (VARR_int *)0x0) break;
      if (uVar9 < pVVar2->els_num) {
        pVVar3 = gen_ctx->lr_ctx->scan_var_to_var_map;
        if (pVVar3->varr == (MIR_reg_t *)0x0) goto LAB_0016cd56;
        uVar5 = pVVar3->els_num + 1;
        if (pVVar3->size < uVar5) {
          sVar8 = (uVar5 >> 1) + uVar5;
          pMVar7 = (MIR_reg_t *)realloc(pVVar3->varr,sVar8 * 4);
          pVVar3->varr = pMVar7;
          pVVar3->size = sVar8;
        }
        sVar8 = pVVar3->els_num;
        pVVar3->els_num = sVar8 + 1;
        pVVar3->varr[sVar8] = var;
        plVar4 = gen_ctx->lr_ctx;
        pVVar2 = plVar4->var_to_scan_var_map;
        iVar1 = plVar4->scan_vars_num;
        plVar4->scan_vars_num = iVar1 + 1;
        if (((pVVar2 != (VARR_int *)0x0) && (pVVar2->varr != (int *)0x0)) &&
           (uVar9 < pVVar2->els_num)) {
          pVVar2->varr[uVar9] = iVar1;
          return;
        }
        goto LAB_0016cd51;
      }
      if (pVVar2->varr == (int *)0x0) goto LAB_0016cd47;
      uVar5 = pVVar2->els_num + 1;
      if (pVVar2->size < uVar5) {
        sVar8 = (uVar5 >> 1) + uVar5;
        piVar6 = (int *)realloc(pVVar2->varr,sVar8 * 4);
        pVVar2->varr = piVar6;
        pVVar2->size = sVar8;
      }
      sVar8 = pVVar2->els_num;
      pVVar2->els_num = sVar8 + 1;
      pVVar2->varr[sVar8] = -1;
    }
    collect_scan_var_cold_4();
LAB_0016cd47:
    collect_scan_var_cold_1();
  }
  collect_scan_var_cold_5();
LAB_0016cd51:
  collect_scan_var_cold_2();
LAB_0016cd56:
  collect_scan_var_cold_3();
  return;
}

Assistant:

static void collect_scan_var (gen_ctx_t gen_ctx, MIR_reg_t var) {
  if (!bitmap_set_bit_p (temp_bitmap, var)) return;
  if (scan_vars_num >= MIR_MAX_COALESCE_VARS) return;
  while (VARR_LENGTH (int, var_to_scan_var_map) <= var) VARR_PUSH (int, var_to_scan_var_map, -1);
  VARR_PUSH (MIR_reg_t, scan_var_to_var_map, var);
  VARR_SET (int, var_to_scan_var_map, var, scan_vars_num++);
}